

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

void QDirPrivate::sortFileList
               (SortFlags sort,QFileInfoList *l,QStringList *names,QFileInfoList *infos)

{
  QFlagsStorage<QDir::SortFlag> QVar1;
  qsizetype qVar2;
  long lVar3;
  QDirSortItem *__last;
  QFileInfo *pQVar4;
  ulong aalloc;
  long in_FS_OFFSET;
  _Iter_comp_iter<QDirSortItemComparator> __comp;
  _Iter_comp_iter<QDirSortItemComparator> __comp_00;
  QCollator coll;
  QVarLengthArray<QDirSortItem,_64LL> si;
  QString local_e70;
  QFlagsStorage<QDir::SortFlag> local_e54;
  QString local_e50;
  QDirSortItem local_e38 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  aalloc = (l->d).size;
  local_e54.i = (Int)sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.
                     super_QFlagsStorage<QDir::SortFlag>.i;
  if (aalloc == 0) goto LAB_0022bc17;
  if ((aalloc == 1) ||
     ((~(uint)sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.
              i & 3) == 0)) {
    if (infos != (QFileInfoList *)0x0) {
      QArrayDataPointer<QFileInfo>::operator=(&infos->d,&l->d);
    }
    if ((names != (QStringList *)0x0) && (lVar3 = (l->d).size, lVar3 != 0)) {
      pQVar4 = (l->d).ptr;
      lVar3 = lVar3 << 3;
      do {
        QFileInfo::fileName(&local_e50,pQVar4);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)names,(names->d).size,&local_e50);
        QList<QString>::end(names);
        if (&(local_e50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_e50.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar4 = pQVar4 + 1;
        lVar3 = lVar3 + -8;
      } while (lVar3 != 0);
    }
    goto LAB_0022bc17;
  }
  memset(&local_e50,0xaa,0xe18);
  local_e50.d.d = (Data *)0x40;
  local_e50.d.ptr = (char16_t *)0x0;
  local_e50.d.size = (qsizetype)local_e38;
  if (0x40 < aalloc) {
    QVLABase<QDirSortItem>::reallocate_impl
              ((QVLABase<QDirSortItem> *)&local_e50,0x40,local_e38,0,aalloc);
  }
  if (aalloc != 0) {
    lVar3 = 0;
    do {
      QVLABase<QDirSortItem>::emplace_back_impl<QFileInfo_const&,QFlags<QDir::SortFlag>&>
                ((QVLABase<QDirSortItem> *)&local_e50,0x40,local_e38,
                 (QFileInfo *)((long)&(((l->d).ptr)->d_ptr).d.ptr + lVar3),
                 (QFlags<QDir::SortFlag> *)&local_e54);
      lVar3 = lVar3 + 8;
    } while (aalloc * 8 - lVar3 != 0);
  }
  qVar2 = local_e50.d.size;
  QVar1.i = local_e54.i;
  if ((local_e54.i & 0x40U) == 0) {
    if (aalloc != 0) {
      __last = (QDirSortItem *)(local_e50.d.size + aalloc * 0x38);
      lVar3 = 0x3f;
      if (aalloc != 0) {
        for (; aalloc >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<QDirSortItem*,long,__gnu_cxx::__ops::_Iter_comp_iter<QDirSortItemComparator>>
                ((QDirSortItem *)local_e50.d.size,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<QDirSortItemComparator>)ZEXT416((uint)local_e54.i));
      std::
      __final_insertion_sort<QDirSortItem*,__gnu_cxx::__ops::_Iter_comp_iter<QDirSortItemComparator>>
                ((QDirSortItem *)qVar2,__last,
                 (_Iter_comp_iter<QDirSortItemComparator>)ZEXT416((uint)QVar1.i));
      goto LAB_0022bb2a;
    }
  }
  else {
    local_e70.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QCollator::QCollator((QCollator *)&local_e70);
    qVar2 = local_e50.d.size;
    QVar1.i = local_e54.i;
    if ((local_e54.i & 0x10U) != 0) {
      QCollator::setCaseSensitivity((QCollator *)&local_e70,CaseInsensitive);
    }
    if (aalloc != 0) {
      lVar3 = 0x3f;
      if (aalloc != 0) {
        for (; aalloc >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      __comp_00._M_comp._4_4_ = 0;
      __comp_00._M_comp.qt_cmp_si_sort_flags.super_QFlagsStorageHelper<QDir::SortFlag,_4>.
      super_QFlagsStorage<QDir::SortFlag>.i =
           (QFlagsStorageHelper<QDir::SortFlag,_4>)(QFlagsStorageHelper<QDir::SortFlag,_4>)QVar1.i;
      __comp_00._M_comp.collator = (QCollator *)&local_e70;
      std::
      __introsort_loop<QDirSortItem*,long,__gnu_cxx::__ops::_Iter_comp_iter<QDirSortItemComparator>>
                ((QDirSortItem *)qVar2,(QDirSortItem *)(qVar2 + aalloc * 0x38),
                 (ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,__comp_00);
      __comp._M_comp._4_4_ = 0;
      __comp._M_comp.qt_cmp_si_sort_flags.super_QFlagsStorageHelper<QDir::SortFlag,_4>.
      super_QFlagsStorage<QDir::SortFlag>.i =
           (QFlagsStorageHelper<QDir::SortFlag,_4>)(QFlagsStorageHelper<QDir::SortFlag,_4>)QVar1.i;
      __comp._M_comp.collator = (QCollator *)&local_e70;
      std::
      __final_insertion_sort<QDirSortItem*,__gnu_cxx::__ops::_Iter_comp_iter<QDirSortItemComparator>>
                ((QDirSortItem *)qVar2,(QDirSortItem *)(qVar2 + aalloc * 0x38),__comp);
    }
    QCollator::~QCollator((QCollator *)&local_e70);
LAB_0022bb2a:
    if (aalloc != 0) {
      lVar3 = 0x30;
      do {
        pQVar4 = (QFileInfo *)((long)&(((QString *)local_e50.d.size)->d).d + lVar3);
        if (infos != (QFileInfoList *)0x0) {
          QtPrivate::QMovableArrayOps<QFileInfo>::emplace<QFileInfo_const&>
                    ((QMovableArrayOps<QFileInfo> *)infos,(infos->d).size,pQVar4);
          QList<QFileInfo>::end(infos);
        }
        if (names != (QStringList *)0x0) {
          if (*(long *)(local_e50.d.size + lVar3 + -0x28) == 0) {
            QFileInfo::fileName(&local_e70,pQVar4);
          }
          else {
            local_e70.d.d = *(Data **)(local_e50.d.size + lVar3 + -0x30);
            local_e70.d.ptr = *(char16_t **)(local_e50.d.size + lVar3 + -0x28);
            local_e70.d.size = *(qsizetype *)(local_e50.d.size + lVar3 + -0x20);
            if (&(local_e70.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_e70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_e70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
          }
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)names,(names->d).size,&local_e70);
          QList<QString>::end(names);
          if (&(local_e70.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_e70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_e70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_e70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_e70.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        lVar3 = lVar3 + 0x38;
        aalloc = aalloc - 1;
      } while (aalloc != 0);
    }
  }
  std::_Destroy_n_aux<false>::__destroy_n<QDirSortItem*,long_long>
            ((QDirSortItem *)local_e50.d.size,(longlong)local_e50.d.ptr);
  if ((QDirSortItem *)local_e50.d.size != local_e38) {
    QtPrivate::sizedFree((void *)local_e50.d.size,(long)local_e50.d.d * 0x38);
  }
LAB_0022bc17:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QDirPrivate::sortFileList(QDir::SortFlags sort, const QFileInfoList &l,
                                      QStringList *names, QFileInfoList *infos)
{
    Q_ASSERT(names || infos);
    Q_ASSERT(!infos || infos->isEmpty());
    Q_ASSERT(!names || names->isEmpty());

    const qsizetype n = l.size();
    if (n == 0)
        return;

    if (n == 1 || (sort & QDir::SortByMask) == QDir::Unsorted) {
        if (infos)
            *infos = l;

        if (names) {
            for (const QFileInfo &fi : l)
                names->append(fi.fileName());
        }
    } else {
        QVarLengthArray<QDirSortItem, 64> si;
        si.reserve(n);
        for (qsizetype i = 0; i < n; ++i)
            si.emplace_back(l.at(i), sort);

#ifndef QT_BOOTSTRAPPED
    if (sort.testAnyFlag(QDir::LocaleAware)) {
            QCollator coll;
            std::sort(si.data(), si.data() + n, QDirSortItemComparator(sort, &coll));
        } else {
            std::sort(si.data(), si.data() + n, QDirSortItemComparator(sort));
        }
#else
        std::sort(si.data(), si.data() + n, QDirSortItemComparator(sort));
#endif // QT_BOOTSTRAPPED

        // put them back in the list(s)
        for (qsizetype i = 0; i < n; ++i) {
            auto &fileInfo = si[i].item;
            if (infos)
                infos->append(fileInfo);
            if (names) {
                const bool cached = !si[i].filename_cache.isNull();
                names->append(cached ? si[i].filename_cache : fileInfo.fileName());
            }
        }
    }
}